

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexSeparableKernel::flipV(PtexSeparableKernel *this)

{
  this->v = (1 << ((this->res).vlog2 & 0x1fU)) - (this->v + this->vw);
  std::__reverse<float*>(this->kv,this->kv + this->vw);
  return;
}

Assistant:

int v() const { return 1<<(unsigned)vlog2; }